

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

int KYBER_marshal_private_key(CBB *out,KYBER_private_key *private_key)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint8_t *out_00;
  uint8_t *s_output;
  uint8_t *local_30;
  
  iVar1 = CBB_add_space(out,&local_30,0x480);
  uVar2 = 0;
  if (iVar1 != 0) {
    lVar3 = 0x1840;
    out_00 = local_30;
    do {
      scalar_encode(out_00,(scalar *)((long)&private_key->opaque + lVar3),0xc);
      out_00 = out_00 + 0x180;
      lVar3 = lVar3 + 0x200;
    } while (lVar3 != 0x1e40);
    iVar1 = kyber_marshal_public_key(out,(public_key *)private_key);
    if (iVar1 != 0) {
      iVar1 = CBB_add_bytes(out,(private_key->opaque).bytes + 0x620,0x20);
      if (iVar1 != 0) {
        iVar1 = CBB_add_bytes(out,(private_key->opaque).bytes + 0x1e40,0x20);
        uVar2 = (uint)(iVar1 != 0);
      }
    }
  }
  return uVar2;
}

Assistant:

int KYBER_marshal_private_key(CBB *out,
                              const struct KYBER_private_key *private_key) {
  const struct private_key *const priv = private_key_from_external(private_key);
  uint8_t *s_output;
  if (!CBB_add_space(out, &s_output, kEncodedVectorSize)) {
    return 0;
  }
  vector_encode(s_output, &priv->s, kLog2Prime);
  if (!kyber_marshal_public_key(out, &priv->pub) ||
      !CBB_add_bytes(out, priv->pub.public_key_hash,
                     sizeof(priv->pub.public_key_hash)) ||
      !CBB_add_bytes(out, priv->fo_failure_secret,
                     sizeof(priv->fo_failure_secret))) {
    return 0;
  }
  return 1;
}